

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst
          (GraphicsRobustAccessPass *this,TypeManager *tm,Instruction *x,Instruction *min,
          Instruction *max,Instruction *where)

{
  uint32_t uVar1;
  uint32_t result_id;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Instruction *pIVar7;
  undefined4 uVar8;
  long lVar9;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  uint32_t local_214;
  uint32_t local_210;
  uint32_t local_20c;
  uint local_208;
  uint32_t local_204;
  SmallVector<unsigned_int,_2UL> local_200;
  SmallVector<unsigned_int,_2UL> local_1d8;
  SmallVector<unsigned_int,_2UL> local_1b0;
  SmallVector<unsigned_int,_2UL> local_188;
  SmallVector<unsigned_int,_2UL> local_160;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined1 local_120 [48];
  undefined4 local_f0;
  SmallVector<unsigned_int,_2UL> local_e8;
  undefined4 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  uVar1 = GetGlslInsts(this);
  result_id = Pass::TakeNextId(&this->super_Pass);
  uVar2 = Instruction::type_id(x);
  pTVar6 = analysis::TypeManager::GetType(tm,uVar2);
  iVar3 = (*pTVar6->_vptr_Type[9])(pTVar6);
  iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0x24);
  uVar2 = Instruction::type_id(min);
  pTVar6 = analysis::TypeManager::GetType(tm,uVar2);
  iVar4 = (*pTVar6->_vptr_Type[9])(pTVar6);
  iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x24);
  uVar2 = Instruction::type_id(max);
  pTVar6 = analysis::TypeManager::GetType(tm,uVar2);
  iVar5 = (*pTVar6->_vptr_Type[9])(pTVar6);
  if (iVar3 != iVar4) {
    __assert_fail("xwidth == minwidth",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                  ,0x287,
                  "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *, Instruction *)"
                 );
  }
  if (iVar3 == *(int *)(CONCAT44(extraout_var_01,iVar5) + 0x24)) {
    uVar2 = Instruction::type_id(x);
    init_list._M_len = 1;
    init_list._M_array = &local_204;
    local_204 = uVar1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_160,init_list);
    uVar8 = 1;
    local_120._0_4_ = uVar8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_120 + 8),&local_160);
    local_208 = 0x2d;
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_208;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_188,init_list_00);
    local_f0 = 7;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e8,&local_188);
    local_20c = Instruction::result_id(x);
    init_list_01._M_len = 1;
    init_list_01._M_array = &local_20c;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1b0,init_list_01);
    local_c0 = uVar8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,&local_1b0);
    local_210 = Instruction::result_id(min);
    init_list_02._M_len = 1;
    init_list_02._M_array = &local_210;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1d8,init_list_02);
    local_90 = uVar8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_1d8);
    local_214 = Instruction::result_id(max);
    init_list_03._M_len = 1;
    init_list_03._M_array = &local_214;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_200,init_list_03);
    local_60 = uVar8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_200);
    local_138 = 0;
    uStack_130 = 0;
    local_128 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_138,
               local_120,&stack0xffffffffffffffd0);
    pIVar7 = InsertInst(this,where,OpExtInst,uVar2,result_id,(OperandList *)&local_138);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_138
              );
    lVar9 = 200;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_120 + lVar9));
      lVar9 = lVar9 + -0x30;
    } while (lVar9 != -0x28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_200);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1d8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1b0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_188);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_160);
    return pIVar7;
  }
  __assert_fail("xwidth == maxwidth",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                ,0x288,
                "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *, Instruction *)"
               );
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeSClampInst(
    const analysis::TypeManager& tm, Instruction* x, Instruction* min,
    Instruction* max, Instruction* where) {
  // Get IDs of instructions we'll be referencing. Evaluate them before calling
  // the function so we force a deterministic ordering in case both of them need
  // to take a new ID.
  const uint32_t glsl_insts_id = GetGlslInsts();
  uint32_t clamp_id = TakeNextId();
  const auto xwidth = tm.GetType(x->type_id())->AsInteger()->width();
  const auto minwidth = tm.GetType(min->type_id())->AsInteger()->width();
  const auto maxwidth = tm.GetType(max->type_id())->AsInteger()->width();
  assert(xwidth == minwidth);
  assert(xwidth == maxwidth);
  (void)xwidth;
  (void)minwidth;
  (void)maxwidth;
  auto* clamp_inst = InsertInst(
      where, spv::Op::OpExtInst, x->type_id(), clamp_id,
      {
          {SPV_OPERAND_TYPE_ID, {glsl_insts_id}},
          {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {GLSLstd450SClamp}},
          {SPV_OPERAND_TYPE_ID, {x->result_id()}},
          {SPV_OPERAND_TYPE_ID, {min->result_id()}},
          {SPV_OPERAND_TYPE_ID, {max->result_id()}},
      });
  return clamp_inst;
}